

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

void Gia_ManProfilePrintOne(Gia_Man_t *p,int i,Vec_Int_t *vArray)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  
  if ((i < 0) || (p->nObjs <= i)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar1 = *(ulong *)(p->pObjs + (uint)i);
  uVar2 = (uint)uVar1;
  uVar7 = (uint)(uVar1 >> 0x20);
  if (((uVar1 & 0x1fffffff) != 0x1fffffff && (int)uVar2 < 0) &&
     (p->vCos->nSize - p->nRegs <= (int)(uVar7 & 0x1fffffff))) {
    return;
  }
  if ((~uVar2 & 0x9fffffff) == 0) {
    uVar9 = 1;
    if ((int)(uVar7 & 0x1fffffff) < p->vCis->nSize - p->nRegs) goto LAB_00220401;
  }
  else {
LAB_00220401:
    if ((p->pMuxes == (uint *)0x0) || (uVar9 = 3, p->pMuxes[(uint)i] == 0)) {
      iVar3 = (int)(uVar1 & 0x1fffffff);
      uVar9 = 2;
      if ((int)uVar2 < 0 || iVar3 == 0x1fffffff) {
        uVar9 = (ulong)((int)uVar2 < 0 && iVar3 != 0x1fffffff);
      }
    }
  }
  if (p->vFanoutNums->nSize <= i) goto LAB_002205ea;
  uVar2 = p->vFanoutNums->pArray[(uint)i];
  printf("%6d : ");
  iVar3 = (int)uVar9;
  if (iVar3 == 0) {
LAB_002204cc:
    iVar5 = iVar3 + -3;
    do {
      printf("  %5s","");
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
  }
  else {
    uVar1 = 1;
    do {
      if ((long)vArray->nSize <= (long)uVar1) goto LAB_002205ea;
      printf("  %5s",GIA_TYPE_STRINGS[vArray->pArray[uVar1]]);
      bVar11 = uVar1 != uVar9;
      uVar1 = uVar1 + 1;
    } while (bVar11);
    if (iVar3 != 3) goto LAB_002204cc;
  }
  printf("  ->");
  if (0 < vArray->nSize) {
    printf(" %5s",GIA_TYPE_STRINGS[*vArray->pArray]);
    printf("  ->");
    if (0 < (int)uVar2) {
      uVar1 = (ulong)(uint)vArray->nSize;
      if (vArray->nSize <= (int)(iVar3 + 1U)) goto LAB_002205ea;
      piVar4 = vArray->pArray;
      iVar3 = piVar4[iVar3 + 1U];
      uVar6 = 1;
      if (uVar2 != 1) {
        lVar8 = (ulong)uVar2 - 1;
        lVar10 = uVar9 + 2;
        do {
          if ((int)uVar1 <= lVar10) goto LAB_002205ea;
          if (iVar3 != piVar4[lVar10]) {
            printf("  %d x %s",uVar6,GIA_TYPE_STRINGS[iVar3]);
            uVar1 = (ulong)vArray->nSize;
            if ((long)uVar1 <= lVar10) goto LAB_002205ea;
            piVar4 = vArray->pArray;
            iVar3 = piVar4[lVar10];
            uVar6 = 0;
          }
          uVar6 = (ulong)((int)uVar6 + 1);
          lVar10 = lVar10 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      printf("  %d x %s",uVar6,GIA_TYPE_STRINGS[iVar3]);
    }
    putchar(10);
    return;
  }
LAB_002205ea:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManProfilePrintOne( Gia_Man_t * p, int i, Vec_Int_t * vArray )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, i );
    int k, nFanins, nFanouts;
    if ( Gia_ObjIsRi(p, pObj) )
        return;
    nFanins = Gia_ObjIsRo(p, pObj) ? 1 : Gia_ObjFaninNum(p, pObj);
    nFanouts = Gia_ObjFanoutNum(p, pObj);

    printf( "%6d : ", i );
    for ( k = 0; k < nFanins; k++ )
        printf( "  %5s", GIA_TYPE_STRINGS[Vec_IntEntry(vArray, k + 1)] );
    for (      ; k < 3; k++ )
        printf( "  %5s", "" );
    printf( "  ->" );
    printf( " %5s", GIA_TYPE_STRINGS[Vec_IntEntry(vArray, 0)] );
    printf( "  ->" );
    if ( nFanouts > 0 )
    {
        int Count = 1, Prev = Vec_IntEntry(vArray, 1 + nFanins);
        for ( k = 1; k < nFanouts; k++ )
        {
            if ( Prev != Vec_IntEntry(vArray, k + 1 + nFanins) )
            {
                printf( "  %d x %s", Count, GIA_TYPE_STRINGS[Prev] );
                Prev = Vec_IntEntry(vArray, k + 1 + nFanins);
                Count = 0;
            }
            Count++;
        }
        printf( "  %d x %s", Count, GIA_TYPE_STRINGS[Prev] );
    }
    printf( "\n" );
}